

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O2

void __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
skipWhitespaceAndComments
          (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           *this)

{
  UTF8Reader *this_00;
  UnicodeChar UVar1;
  UTF8Reader local_70;
  CompileMessage local_68;
  
  this_00 = &this->input;
  while( true ) {
    while( true ) {
      UTF8Reader::findEndOfWhitespace((UTF8Reader *)&local_68);
      this_00->data = local_68.description._M_dataplus._M_p;
      UVar1 = UTF8Reader::operator*(this_00);
      if (UVar1 != 0x2f) {
        return;
      }
      UTF8Reader::operator+((UTF8Reader *)&local_68,(int)this_00);
      UVar1 = UTF8Reader::operator*((UTF8Reader *)&local_68);
      if (UVar1 != 0x2a) break;
      (this->location).location.data = (this->input).data;
      UTF8Reader::operator+(&local_70,(int)this_00);
      UTF8Reader::find((UTF8Reader *)&local_68,(char *)&local_70);
      (this->input).data = local_68.description._M_dataplus._M_p;
      if (*local_68.description._M_dataplus._M_p == '\0') {
        Errors::unterminatedComment<>();
        (*this->_vptr_Tokeniser[2])(this,&local_68);
        CompileMessage::~CompileMessage(&local_68);
      }
      UTF8Reader::operator+=(this_00,2);
    }
    if (UVar1 != 0x2f) break;
    UTF8Reader::find((UTF8Reader *)&local_68,(char *)this_00);
    this_00->data = local_68.description._M_dataplus._M_p;
  }
  return;
}

Assistant:

void skipWhitespaceAndComments()
    {
        for (;;)
        {
            input = input.findEndOfWhitespace();

            if (*input == '/')
            {
                auto c2 = *(input + 1);

                if (c2 == '/')  { input = input.find ("\n"); continue; }

                if (c2 == '*')
                {
                    location.location = input;
                    input = (input + 2).find ("*/");
                    if (input.isEmpty()) throwError (Errors::unterminatedComment());
                    input += 2; continue;
                }
            }

            break;
        }
    }